

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_short_writes.c
# Opt level: O1

ssize_t short_write_callback(archive *a,void *client_data,void *buffer,size_t length)

{
  void *pvVar1;
  size_t __n;
  size_t __size;
  
  __n = 100;
  if (length < 100) {
    __n = length;
  }
  __size = *(long *)((long)client_data + 0x10) + __n;
  pvVar1 = realloc(*(void **)((long)client_data + 8),__size);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_short_writes.c"
                   ,L':',(uint)(pvVar1 != (void *)0x0),"new_buf != NULL",(void *)0x0);
  *(void **)((long)client_data + 8) = pvVar1;
  memcpy((void *)((long)pvVar1 + *(long *)((long)client_data + 0x10)),buffer,__n);
  *(size_t *)((long)client_data + 0x10) = __size;
  return __n;
}

Assistant:

static ssize_t
short_write_callback(struct archive *a, void *client_data, const void *buffer, size_t length)
{
        (void)a;

        struct checker *checker = client_data;
        size_t to_write = length < 100 ? length : 100;
        size_t new_len = checker->shortbuf_len + to_write;
        char *new_buf = realloc(checker->shortbuf, new_len);
        assert(new_buf != NULL);

        checker->shortbuf = new_buf;
        memcpy(checker->shortbuf + checker->shortbuf_len, buffer, to_write);
        checker->shortbuf_len = new_len;

        return to_write;
}